

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brandes.cpp
# Opt level: O1

void write_results(string *file_name)

{
  long lVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  ostream *poVar5;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range1;
  pair<int,_double> *ppVar6;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> result_vertices;
  ofstream output_file;
  pair<int,_double> *local_258;
  iterator iStack_250;
  pair<int,_double> *local_248;
  double local_240;
  pair<int,_double> local_238;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream((string *)&local_228);
  std::ofstream::open((string *)&local_228,(_Ios_Openmode)file_name);
  local_258 = (pair<int,_double> *)0x0;
  iStack_250._M_current = (pair<int,_double> *)0x0;
  local_248 = (pair<int,_double> *)0x0;
  if ((_Rb_tree_header *)non_dead_end_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      != &non_dead_end_vertices._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = non_dead_end_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_238.first =
           read_remapped.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(int)p_Var3[1]._M_color];
      local_238.second =
           betweenness_centrality.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[(int)p_Var3[1]._M_color];
      if (iStack_250._M_current == local_248) {
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        _M_realloc_insert<std::pair<int,double>>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&local_258
                   ,iStack_250,&local_238);
      }
      else {
        *(ulong *)iStack_250._M_current = CONCAT44(local_238._4_4_,local_238.first);
        (iStack_250._M_current)->second = local_238.second;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &non_dead_end_vertices._M_t._M_impl.super__Rb_tree_header)
    ;
  }
  iVar2._M_current = iStack_250._M_current;
  ppVar6 = local_258;
  if (local_258 != iStack_250._M_current) {
    uVar4 = (long)iStack_250._M_current - (long)local_258 >> 4;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_258,iStack_250._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar6,iVar2._M_current);
  }
  iVar2._M_current = iStack_250._M_current;
  if (local_258 != iStack_250._M_current) {
    ppVar6 = local_258;
    do {
      local_240 = ppVar6->second;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,ppVar6->first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::ostream::_M_insert<double>(local_240);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != iVar2._M_current);
  }
  std::ofstream::close();
  if (local_258 != (pair<int,_double> *)0x0) {
    operator_delete(local_258,(long)local_248 - (long)local_258);
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void write_results(std::string file_name) {
    std::ofstream output_file;
    output_file.open(file_name);

    std::vector<std::pair<int, double>> result_vertices;

    for (auto v : non_dead_end_vertices) {
        result_vertices.push_back(std::pair<int, double>(read_remapped[v], betweenness_centrality[v]));
    }

    sort(result_vertices.begin(), result_vertices.end());

    for (auto v : result_vertices) {
        output_file << v.first << " " << v.second << std::endl;
    }

    output_file.close();
}